

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushFocusScope(ImGuiID id)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiID id_local;
  
  pIVar1 = GImGui->CurrentWindow;
  ImVector<unsigned_int>::push_back(&GImGui->FocusScopeStack,&(pIVar1->DC).NavFocusScopeIdCurrent);
  (pIVar1->DC).NavFocusScopeIdCurrent = id;
  return;
}

Assistant:

void ImGui::PushFocusScope(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    g.FocusScopeStack.push_back(window->DC.NavFocusScopeIdCurrent);
    window->DC.NavFocusScopeIdCurrent = id;
}